

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O0

void __thiscall
QMainWindow::resizeDocks
          (QMainWindow *this,QList<QDockWidget_*> *docks,QList<int> *sizes,Orientation orientation)

{
  QMainWindowLayout *pQVar1;
  Orientation in_stack_00000044;
  QList<int> *in_stack_00000048;
  QList<QDockWidget_*> *in_stack_00000050;
  QDockAreaLayout *in_stack_00000058;
  
  d_func((QMainWindow *)0x5ea809);
  QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5ea818);
  QDockAreaLayout::resizeDocks
            (in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000044);
  d_func((QMainWindow *)0x5ea845);
  pQVar1 = QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5ea854);
  (**(code **)(*(long *)&pQVar1->super_QLayout + 0x70))();
  return;
}

Assistant:

void QMainWindow::resizeDocks(const QList<QDockWidget *> &docks,
                              const QList<int> &sizes, Qt::Orientation orientation)
{
    d_func()->layout->layoutState.dockAreaLayout.resizeDocks(docks, sizes, orientation);
    d_func()->layout->invalidate();
}